

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

ArraySubscript * new_array_subscript(void *name,void *expr)

{
  void *any;
  ArraySubscript *pAVar1;
  TreeNode *pTVar2;
  ArraySubscript *term;
  void *expr_local;
  void *name_local;
  
  any = malloc(0x20);
  pAVar1 = (ArraySubscript *)require_not_null(any,"Failed to allocate space");
  pTVar2 = new_tree_node((Token *)0x0,subscript_eval);
  (pAVar1->node).eval = pTVar2->eval;
  (pAVar1->node).token = pTVar2->token;
  pAVar1->name = name;
  pAVar1->expr = expr;
  return pAVar1;
}

Assistant:

ArraySubscript*  new_array_subscript(void* name, void* expr){
    ArraySubscript* term  = new(ArraySubscript);
    term->node = tree_node_(NULL, eval_handler(subscript_eval));
    term->name = name;
    term->expr = expr;
    return term;
}